

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_test.cpp
# Opt level: O2

int __thiscall QuadDrawer::init(QuadDrawer *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  stbi_uc *__ptr;
  ostream *poVar1;
  int height;
  int width;
  int nrChannels;
  
  glEnable(0xde1);
  glGenTextures(1,&texture);
  glBindTexture(0xde1,texture);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  __ptr = stbi_load("../wall.jpg",&width,&height,&nrChannels,0);
  if (__ptr == (stbi_uc *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    glTexImage2D(0xde1,0,0x1907,width,height,0,0x1907,0x1401,__ptr);
    (*__glewGenerateMipmap)(0xde1);
  }
  free(__ptr);
  return extraout_EAX;
}

Assistant:

void init() {
    glEnable(GL_TEXTURE_2D);
    glGenTextures(1, &texture);
    glBindTexture(GL_TEXTURE_2D, texture);
    // set the texture wrapping/filtering options (on the currently bound texture object)
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    
    /*TODO: Change GL_NEAREST, and compare the effects of the following filters.
      The following are the following potential filter options:
      GL_LINEAR
      GL_NEAREST_MIPMAP_NEAREST
      GL_LINEAR_MIPMAP_NEAREST
      GL_NEAREST_MIPMAP_LINEAR
      GL_LINEAR_MIPMAP_LINEAR
     */
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    // load and generate the texture
    int width, height, nrChannels;
    //TODO: (optional) Change the picture here!
#ifdef _MSC_VER
    unsigned char* data = stbi_load("../../../wall.jpg", &width, &height, &nrChannels, 0);
#else
    unsigned char* data = stbi_load("../wall.jpg", &width, &height, &nrChannels, 0);
#endif
    if (data)
    {
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
    glGenerateMipmap(GL_TEXTURE_2D);
    }
    else
    {
    std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    return;
  }